

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnExport
          (BinaryReaderObjdump *this,Index index,ExternalKind kind,Index item_index,string_view name
          )

{
  ObjdumpState *pOVar1;
  pointer pbVar2;
  ulong uVar3;
  _Alloc_hider _Var4;
  char *pcVar5;
  size_type sVar6;
  
  if ((int)kind < 5) {
    pcVar5 = *(char **)(g_kind_name + (long)(int)kind * 8);
  }
  else {
    pcVar5 = "<error_kind>";
  }
  PrintDetails(this," - %s[%u]",pcVar5,(ulong)item_index);
  if (kind == First) {
    pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
    uVar3 = (ulong)item_index;
    pbVar2 = (pOVar1->function_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var4._M_p = (pointer)0x0;
    sVar6 = 0;
    if (uVar3 < (ulong)((long)(pOVar1->function_names).names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
      _Var4._M_p = pbVar2[uVar3]._M_dataplus._M_p;
      sVar6 = pbVar2[uVar3]._M_string_length;
    }
    if (sVar6 != 0) {
      PrintDetails(this," <%.*s>",sVar6,_Var4._M_p);
    }
  }
  PrintDetails(this," -> \"%.*s\"\n",name.size_ & 0xffffffff,name.data_);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnExport(Index index,
                                     ExternalKind kind,
                                     Index item_index,
                                     string_view name) {
  PrintDetails(" - %s[%" PRIindex "]", GetKindName(kind), item_index);
  if (kind == ExternalKind::Func) {
    auto name = GetFunctionName(item_index);
    if (!name.empty()) {
      PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
    }
  }

  PrintDetails(" -> \"" PRIstringview "\"\n",
               WABT_PRINTF_STRING_VIEW_ARG(name));
  return Result::Ok;
}